

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall
fasttext::DenseMatrix::divideRow(DenseMatrix *this,Vector *denoms,int64_t ib,int64_t ie)

{
  pointer pfVar1;
  float fVar2;
  pointer pfVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  byte bVar19;
  byte bVar20;
  pointer pfVar21;
  int64_t iVar22;
  ulong uVar23;
  ushort uVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  
  if (ie == -1) {
    ie = (this->super_Matrix).m_;
  }
  pfVar3 = (denoms->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ie <= (long)(denoms->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar3 >> 2) {
    if (ib < ie) {
      lVar4 = (this->super_Matrix).n_;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar27 = vpbroadcastq_avx512f();
      pfVar21 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + lVar4 * ib;
      iVar22 = ib;
      do {
        fVar2 = pfVar3[iVar22 - ib];
        if (fVar2 != 0.0 && 0 < lVar4) {
          auVar28 = vbroadcastss_avx512f(ZEXT416((uint)fVar2));
          uVar23 = 0;
          do {
            auVar29 = vpbroadcastq_avx512f();
            auVar30 = vporq_avx512f(auVar29,auVar25);
            auVar29 = vporq_avx512f(auVar29,auVar26);
            uVar18 = vpcmpuq_avx512f(auVar29,auVar27,2);
            bVar19 = (byte)uVar18;
            uVar18 = vpcmpuq_avx512f(auVar30,auVar27,2);
            bVar20 = (byte)uVar18;
            uVar24 = CONCAT11(bVar20,bVar19);
            pfVar1 = pfVar21 + uVar23;
            auVar29._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * (int)pfVar1[1];
            auVar29._0_4_ = (uint)(bVar19 & 1) * (int)*pfVar1;
            auVar29._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * (int)pfVar1[2];
            auVar29._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * (int)pfVar1[3];
            auVar29._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * (int)pfVar1[4];
            auVar29._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * (int)pfVar1[5];
            auVar29._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * (int)pfVar1[6];
            auVar29._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * (int)pfVar1[7];
            auVar29._32_4_ = (uint)(bVar20 & 1) * (int)pfVar1[8];
            auVar29._36_4_ = (uint)(bVar20 >> 1 & 1) * (int)pfVar1[9];
            auVar29._40_4_ = (uint)(bVar20 >> 2 & 1) * (int)pfVar1[10];
            auVar29._44_4_ = (uint)(bVar20 >> 3 & 1) * (int)pfVar1[0xb];
            auVar29._48_4_ = (uint)(bVar20 >> 4 & 1) * (int)pfVar1[0xc];
            auVar29._52_4_ = (uint)(bVar20 >> 5 & 1) * (int)pfVar1[0xd];
            auVar29._56_4_ = (uint)(bVar20 >> 6 & 1) * (int)pfVar1[0xe];
            auVar29._60_4_ = (uint)(bVar20 >> 7) * (int)pfVar1[0xf];
            auVar29 = vdivps_avx512f(auVar29,auVar28);
            pfVar1 = pfVar21 + uVar23;
            bVar5 = (bool)((byte)(uVar24 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar24 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar24 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar24 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar24 >> 6) & 1);
            bVar11 = (bool)((byte)(uVar24 >> 7) & 1);
            bVar12 = (bool)(bVar20 >> 1 & 1);
            bVar13 = (bool)(bVar20 >> 2 & 1);
            bVar14 = (bool)(bVar20 >> 3 & 1);
            bVar15 = (bool)(bVar20 >> 4 & 1);
            bVar16 = (bool)(bVar20 >> 5 & 1);
            bVar17 = (bool)(bVar20 >> 6 & 1);
            *pfVar1 = (float)((uint)(bVar19 & 1) * auVar29._0_4_ |
                             (uint)!(bool)(bVar19 & 1) * (int)*pfVar1);
            pfVar1[1] = (float)((uint)bVar5 * auVar29._4_4_ | (uint)!bVar5 * (int)pfVar1[1]);
            pfVar1[2] = (float)((uint)bVar6 * auVar29._8_4_ | (uint)!bVar6 * (int)pfVar1[2]);
            pfVar1[3] = (float)((uint)bVar7 * auVar29._12_4_ | (uint)!bVar7 * (int)pfVar1[3]);
            pfVar1[4] = (float)((uint)bVar8 * auVar29._16_4_ | (uint)!bVar8 * (int)pfVar1[4]);
            pfVar1[5] = (float)((uint)bVar9 * auVar29._20_4_ | (uint)!bVar9 * (int)pfVar1[5]);
            pfVar1[6] = (float)((uint)bVar10 * auVar29._24_4_ | (uint)!bVar10 * (int)pfVar1[6]);
            pfVar1[7] = (float)((uint)bVar11 * auVar29._28_4_ | (uint)!bVar11 * (int)pfVar1[7]);
            pfVar1[8] = (float)((uint)(bVar20 & 1) * auVar29._32_4_ |
                               (uint)!(bool)(bVar20 & 1) * (int)pfVar1[8]);
            pfVar1[9] = (float)((uint)bVar12 * auVar29._36_4_ | (uint)!bVar12 * (int)pfVar1[9]);
            pfVar1[10] = (float)((uint)bVar13 * auVar29._40_4_ | (uint)!bVar13 * (int)pfVar1[10]);
            pfVar1[0xb] = (float)((uint)bVar14 * auVar29._44_4_ | (uint)!bVar14 * (int)pfVar1[0xb]);
            pfVar1[0xc] = (float)((uint)bVar15 * auVar29._48_4_ | (uint)!bVar15 * (int)pfVar1[0xc]);
            pfVar1[0xd] = (float)((uint)bVar16 * auVar29._52_4_ | (uint)!bVar16 * (int)pfVar1[0xd]);
            pfVar1[0xe] = (float)((uint)bVar17 * auVar29._56_4_ | (uint)!bVar17 * (int)pfVar1[0xe]);
            pfVar1[0xf] = (float)((uint)(bVar20 >> 7) * auVar29._60_4_ |
                                 (uint)!(bool)(bVar20 >> 7) * (int)pfVar1[0xf]);
            uVar23 = uVar23 + 0x10;
          } while ((lVar4 + 0xfU & 0xfffffffffffffff0) != uVar23);
        }
        iVar22 = iVar22 + 1;
        pfVar21 = pfVar21 + lVar4;
      } while (iVar22 != ie);
    }
    return;
  }
  __assert_fail("ie <= denoms.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                ,0x4f,"void fasttext::DenseMatrix::divideRow(const Vector &, int64_t, int64_t)");
}

Assistant:

void DenseMatrix::divideRow(const Vector& denoms, int64_t ib, int64_t ie) {
  if (ie == -1) {
    ie = m_;
  }
  assert(ie <= denoms.size());
  for (auto i = ib; i < ie; i++) {
    real n = denoms[i - ib];
    if (n != 0) {
      for (auto j = 0; j < n_; j++) {
        at(i, j) /= n;
      }
    }
  }
}